

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::ResultBuilder::allowThrows(ResultBuilder *this)

{
  int iVar1;
  IContext *pIVar2;
  IConfig *pIVar3;
  Ptr<const_Catch::IConfig> local_18;
  ResultBuilder *local_10;
  ResultBuilder *this_local;
  
  local_10 = this;
  pIVar2 = getCurrentContext();
  (*pIVar2->_vptr_IContext[6])();
  pIVar3 = Ptr<const_Catch::IConfig>::operator->(&local_18);
  iVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  Ptr<const_Catch::IConfig>::~Ptr(&local_18);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool ResultBuilder::allowThrows() const { return getCurrentContext().getConfig()->allowThrows(); }